

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

void __thiscall cmCTestTestHandler::ComputeTestListForRerunFailed(cmCTestTestHandler *this)

{
  pointer pcVar1;
  pointer piVar2;
  pointer piVar3;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  cmCTestTestProperties *tp;
  pointer __x;
  int cnt;
  ListOfTests finalList;
  int local_4c;
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  local_48;
  
  ExpandTestsToRunInformationForRerunFailed(this);
  local_48.
  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4c = 0;
  __x = (this->TestList).
        super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (this->TestList).
           super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__x != pcVar1) {
    do {
      local_4c = local_4c + 1;
      piVar2 = (this->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (this->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((piVar2 == piVar3) ||
         (_Var4 = std::
                  __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                            (piVar2,piVar3,&local_4c),
         _Var4._M_current !=
         (this->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish)) {
        __x->Index = local_4c;
        std::
        vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
        ::push_back(&local_48,__x);
      }
      __x = __x + 1;
    } while (__x != pcVar1);
  }
  UpdateForFixtures(this,&local_48);
  this->TotalNumberOfTests =
       ((long)(this->TestList).
              super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->TestList).
              super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
              ._M_impl.super__Vector_impl_data._M_start >> 8) * -0x5555555555555555;
  std::
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  ::operator=(&this->TestList,&local_48);
  UpdateMaxTestNameWidth(this);
  std::
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void cmCTestTestHandler::ComputeTestListForRerunFailed()
{
  this->ExpandTestsToRunInformationForRerunFailed();

  ListOfTests finalList;
  int cnt = 0;
  for (cmCTestTestProperties& tp : this->TestList) {
    cnt++;

    // if this test is not in our list of tests to run, then skip it.
    if (!this->TestsToRun.empty() && !cm::contains(this->TestsToRun, cnt)) {
      continue;
    }

    tp.Index = cnt;
    finalList.push_back(tp);
  }

  this->UpdateForFixtures(finalList);

  // Save the total number of tests before exclusions
  this->TotalNumberOfTests = this->TestList.size();

  // Set the TestList to the list of failed tests to rerun
  this->TestList = finalList;

  this->UpdateMaxTestNameWidth();
}